

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEdit::setAlignment(QTextEdit *this,Alignment a)

{
  QTextEditPrivate *this_00;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_58;
  undefined1 *puStack_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_58);
  ::QVariant::QVariant
            ((QVariant *)&local_48,
             (int)a.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i);
  QTextFormat::setProperty((int)&local_58,(QVariant *)0x1010);
  ::QVariant::~QVariant((QVariant *)&local_48);
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor((QWidgetTextControl *)local_48.data);
  QTextCursor::mergeBlockFormat((QTextBlockFormat *)local_48.data);
  QWidgetTextControl::setTextCursor
            ((QWidgetTextControl *)this_00->control,(QTextCursor *)local_48.data,false);
  QTextEditPrivate::relayoutDocument(this_00);
  QTextCursor::~QTextCursor((QTextCursor *)local_48.data);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::setAlignment(Qt::Alignment a)
{
    Q_D(QTextEdit);
    QTextBlockFormat fmt;
    fmt.setAlignment(a);
    QTextCursor cursor = d->control->textCursor();
    cursor.mergeBlockFormat(fmt);
    d->control->setTextCursor(cursor);
    d->relayoutDocument();
}